

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

bool __thiscall QComboBox::event(QComboBox *this,QEvent *event)

{
  ushort uVar1;
  QComboBoxPrivate *this_00;
  QLineEdit *pQVar2;
  bool bVar3;
  undefined1 uVar4;
  QHoverEvent *he;
  long in_FS_OFFSET;
  QPointF local_38;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 - 0x7f < 3) {
    local_38 = QSinglePointEvent::position((QSinglePointEvent *)event);
    local_28 = QPointF::toPoint(&local_38);
    QComboBoxPrivate::updateHoverControl(this_00,&local_28);
  }
  else if (uVar1 == 0x5a) {
LAB_003b4ed6:
    QComboBoxPrivate::updateLayoutDirection(this_00);
    QComboBoxPrivate::updateLineEditGeometry(this_00);
  }
  else if (uVar1 == 0x33) {
    pQVar2 = this_00->lineEdit;
    if (pQVar2 != (QLineEdit *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        uVar4 = (**(code **)(*(long *)&pQVar2->super_QWidget + 0x28))(pQVar2,event);
        return (bool)uVar4;
      }
      goto LAB_003b4f67;
    }
  }
  else if (uVar1 == 0x25) goto LAB_003b4ed6;
  bVar3 = QWidget::event(&this->super_QWidget,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
LAB_003b4f67:
  __stack_chk_fail();
}

Assistant:

bool QComboBox::event(QEvent *event)
{
    Q_D(QComboBox);
    switch(event->type()) {
    case QEvent::LayoutDirectionChange:
    case QEvent::ApplicationLayoutDirectionChange:
        d->updateLayoutDirection();
        d->updateLineEditGeometry();
        break;
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        if (const QHoverEvent *he = static_cast<const QHoverEvent *>(event))
            d->updateHoverControl(he->position().toPoint());
        break;
    case QEvent::ShortcutOverride:
        if (d->lineEdit)
            return d->lineEdit->event(event);
        break;
#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::EnterEditFocus:
        if (d->lineEdit)
            d->lineEdit->event(event);  //so cursor starts
        break;
    case QEvent::LeaveEditFocus:
        if (d->lineEdit)
            d->lineEdit->event(event);  //so cursor stops
        break;
#endif
    default:
        break;
    }
    return QWidget::event(event);
}